

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validationinterface.cpp
# Opt level: O0

void __thiscall
ValidationSignals::TransactionAddedToMempool
          (ValidationSignals *this,NewMempoolTransactionInfo *tx,uint64_t mempool_sequence)

{
  long lVar1;
  string_view logging_function;
  bool bVar2;
  pointer pTVar3;
  long in_FS_OFFSET;
  char *local_name;
  anon_class_64_3_5d17f6a9_for_event event;
  undefined4 in_stack_fffffffffffffe28;
  undefined4 in_stack_fffffffffffffe2c;
  char *in_stack_fffffffffffffe30;
  anon_class_64_3_5d17f6a9_for_event *in_stack_fffffffffffffe38;
  anon_class_120_3_0beed0e2 *in_stack_fffffffffffffe40;
  function<void_()> *in_stack_fffffffffffffe48;
  LogFlags in_stack_fffffffffffffe90;
  int in_stack_fffffffffffffe9c;
  undefined1 local_148 [32];
  ConstevalFormatString<3U> in_stack_fffffffffffffed8;
  string_view in_stack_fffffffffffffee0;
  size_t in_stack_fffffffffffffef0;
  char *pcVar4;
  Level in_stack_ffffffffffffffd0;
  element_type *in_stack_ffffffffffffffe0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_ffffffffffffffe8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffff0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  NewMempoolTransactionInfo::NewMempoolTransactionInfo
            (&in_stack_fffffffffffffe38->tx,(NewMempoolTransactionInfo *)in_stack_fffffffffffffe30);
  pcVar4 = "TransactionAddedToMempool";
  bVar2 = ::LogAcceptCategory(CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),Trace);
  if (bVar2) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffe48,
               (char *)in_stack_fffffffffffffe40);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffe48,
               (char *)in_stack_fffffffffffffe40);
    std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
    CTransaction::GetHash
              ((CTransaction *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
    transaction_identifier<false>::ToString_abi_cxx11_
              ((transaction_identifier<false> *)in_stack_fffffffffffffe30);
    std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
    CTransaction::GetWitnessHash
              ((CTransaction *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
    transaction_identifier<true>::ToString_abi_cxx11_
              ((transaction_identifier<true> *)in_stack_fffffffffffffe30);
    in_stack_fffffffffffffe48 = (function<void_()> *)&stack0xffffffffffffffb8;
    in_stack_fffffffffffffe40 = (anon_class_120_3_0beed0e2 *)&stack0xffffffffffffffd8;
    in_stack_fffffffffffffe38 = (anon_class_64_3_5d17f6a9_for_event *)&stack0xfffffffffffffef8;
    in_stack_fffffffffffffe30 = "Enqueuing %s: txid=%s wtxid=%s\n";
    in_stack_fffffffffffffe28 = 1;
    logging_function._M_str = pcVar4;
    logging_function._M_len = in_stack_fffffffffffffef0;
    LogPrintFormatInternal<char_const*,std::__cxx11::string,std::__cxx11::string>
              (logging_function,in_stack_fffffffffffffee0,in_stack_fffffffffffffe9c,
               in_stack_fffffffffffffe90,in_stack_ffffffffffffffd0,in_stack_fffffffffffffed8,
               (char **)in_stack_ffffffffffffffe0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffffe8._M_pi,in_stack_fffffffffffffff0);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
  }
  std::unique_ptr<ValidationSignalsImpl,_std::default_delete<ValidationSignalsImpl>_>::operator->
            ((unique_ptr<ValidationSignalsImpl,_std::default_delete<ValidationSignalsImpl>_> *)
             CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
  pTVar3 = std::
           unique_ptr<util::TaskRunnerInterface,_std::default_delete<util::TaskRunnerInterface>_>::
           operator->((unique_ptr<util::TaskRunnerInterface,_std::default_delete<util::TaskRunnerInterface>_>
                       *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
  NewMempoolTransactionInfo::NewMempoolTransactionInfo
            (&in_stack_fffffffffffffe38->tx,(NewMempoolTransactionInfo *)in_stack_fffffffffffffe30);
  TransactionAddedToMempool(NewMempoolTransactionInfo_const&,unsigned_long)::$_1::__1
            (in_stack_fffffffffffffe38,
             (anon_class_64_3_5d17f6a9_for_event *)in_stack_fffffffffffffe30);
  std::function<void()>::
  function<ValidationSignals::TransactionAddedToMempool(NewMempoolTransactionInfo_const&,unsigned_long)::__0,void>
            (in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
  (*pTVar3->_vptr_TaskRunnerInterface[2])(pTVar3,local_148);
  std::function<void_()>::~function
            ((function<void_()> *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
  TransactionAddedToMempool(NewMempoolTransactionInfo_const&,unsigned_long)::$_0::~__0
            ((anon_class_120_3_0beed0e2 *)
             CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
  TransactionAddedToMempool(NewMempoolTransactionInfo_const&,unsigned_long)::$_1::~__1
            ((anon_class_64_3_5d17f6a9_for_event *)
             CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void ValidationSignals::TransactionAddedToMempool(const NewMempoolTransactionInfo& tx, uint64_t mempool_sequence)
{
    auto event = [tx, mempool_sequence, this] {
        m_internals->Iterate([&](CValidationInterface& callbacks) { callbacks.TransactionAddedToMempool(tx, mempool_sequence); });
    };
    ENQUEUE_AND_LOG_EVENT(event, "%s: txid=%s wtxid=%s", __func__,
                          tx.info.m_tx->GetHash().ToString(),
                          tx.info.m_tx->GetWitnessHash().ToString());
}